

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab8-0.c
# Opt level: O2

int Check(void)

{
  uint uVar1;
  uint i;
  int iVar2;
  uint uVar3;
  uint uVar4;
  FILE *__stream;
  char *__s;
  size_t __n;
  ulong uVar5;
  char *pcVar6;
  int rootCount;
  uint uVar7;
  uint idx;
  uint edgeIdx;
  uint uVar8;
  TTestcaseData TVar9;
  uint b;
  uint a;
  ulong local_4e68;
  FILE *local_4e60;
  char bufMsg [128];
  
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    uVar3 = 0xffffffff;
    puts("can\'t open out.txt");
    goto LAB_00101756;
  }
  TVar9 = GetFromTestcase(TestcaseIdx,ERROR_MESSAGE,0xffffffff);
  pcVar6 = TVar9.String;
  if (pcVar6 == (char *)0x0) {
    uVar3 = GetVertexCount();
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      *(int *)(bufMsg + uVar5 * 4) = (int)uVar5;
    }
    uVar8 = 0;
    local_4e68 = 0;
    local_4e60 = __stream;
    while (__stream = local_4e60, uVar8 = uVar8 + 1, uVar8 < uVar3) {
      pcVar6 = ScanUintUint((FILE *)local_4e60,&a,&b);
      uVar7 = a;
      uVar1 = b;
      if (pcVar6 != "PASSED") {
LAB_001016a9:
        __s = "FAILED";
        goto LAB_0010170f;
      }
      uVar4 = GetVertexCount();
      if (((uVar7 == 0) || (uVar4 < uVar7)) || (uVar4 <= uVar1 - 1)) {
LAB_00101696:
        printf("wrong output -- ");
        __stream = local_4e60;
        goto LAB_001016a9;
      }
      edgeIdx = 0;
      uVar4 = GetEdgeCount();
      while( true ) {
        if (uVar4 == edgeIdx) goto LAB_00101696;
        TVar9 = GetFromTestcase(TestcaseIdx,EDGE,edgeIdx);
        if ((uVar1 == TVar9.Edge.End && uVar7 == TVar9.Edge.Begin) ||
           (TVar9.Edge.End == uVar7 && uVar1 == TVar9.Edge.Begin)) break;
        edgeIdx = edgeIdx + 1;
      }
      if (edgeIdx == 0xffffffff) goto LAB_00101696;
      uVar1 = a - 1;
      do {
        uVar7 = uVar1;
        uVar1 = *(uint *)(bufMsg + (ulong)uVar7 * 4);
      } while (uVar7 != *(uint *)(bufMsg + (ulong)uVar7 * 4));
      uVar1 = b - 1;
      do {
        uVar4 = uVar1;
        uVar1 = *(uint *)(bufMsg + (ulong)uVar4 * 4);
      } while (uVar4 != *(uint *)(bufMsg + (ulong)uVar4 * 4));
      if (uVar7 == uVar4) goto LAB_00101696;
      *(uint *)(bufMsg + (ulong)uVar7 * 4) = uVar4;
      TVar9 = GetFromTestcase(TestcaseIdx,EDGE,edgeIdx);
      local_4e68 = local_4e68 + TVar9.Edge.Length;
    }
    iVar2 = 0;
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      iVar2 = iVar2 + (uint)(uVar5 == *(uint *)(bufMsg + uVar5 * 4));
    }
    if (iVar2 == 1) {
      TVar9 = GetFromTestcase(TestcaseIdx,MST_LENGTH,0xffffffff);
      __s = "PASSED";
      if (local_4e68 <= TVar9.Integer) goto LAB_0010170f;
    }
LAB_001016fa:
    printf("wrong output -- ");
    __s = "FAILED";
  }
  else {
    bufMsg[0x70] = '\0';
    bufMsg[0x71] = '\0';
    bufMsg[0x72] = '\0';
    bufMsg[0x73] = '\0';
    bufMsg[0x74] = '\0';
    bufMsg[0x75] = '\0';
    bufMsg[0x76] = '\0';
    bufMsg[0x77] = '\0';
    bufMsg[0x78] = '\0';
    bufMsg[0x79] = '\0';
    bufMsg[0x7a] = '\0';
    bufMsg[0x7b] = '\0';
    bufMsg[0x7c] = '\0';
    bufMsg[0x7d] = '\0';
    bufMsg[0x7e] = '\0';
    bufMsg[0x7f] = '\0';
    bufMsg[0x60] = '\0';
    bufMsg[0x61] = '\0';
    bufMsg[0x62] = '\0';
    bufMsg[99] = '\0';
    bufMsg[100] = '\0';
    bufMsg[0x65] = '\0';
    bufMsg[0x66] = '\0';
    bufMsg[0x67] = '\0';
    bufMsg[0x68] = '\0';
    bufMsg[0x69] = '\0';
    bufMsg[0x6a] = '\0';
    bufMsg[0x6b] = '\0';
    bufMsg[0x6c] = '\0';
    bufMsg[0x6d] = '\0';
    bufMsg[0x6e] = '\0';
    bufMsg[0x6f] = '\0';
    bufMsg[0x50] = '\0';
    bufMsg[0x51] = '\0';
    bufMsg[0x52] = '\0';
    bufMsg[0x53] = '\0';
    bufMsg[0x54] = '\0';
    bufMsg[0x55] = '\0';
    bufMsg[0x56] = '\0';
    bufMsg[0x57] = '\0';
    bufMsg[0x58] = '\0';
    bufMsg[0x59] = '\0';
    bufMsg[0x5a] = '\0';
    bufMsg[0x5b] = '\0';
    bufMsg[0x5c] = '\0';
    bufMsg[0x5d] = '\0';
    bufMsg[0x5e] = '\0';
    bufMsg[0x5f] = '\0';
    bufMsg[0x40] = '\0';
    bufMsg[0x41] = '\0';
    bufMsg[0x42] = '\0';
    bufMsg[0x43] = '\0';
    bufMsg[0x44] = '\0';
    bufMsg[0x45] = '\0';
    bufMsg[0x46] = '\0';
    bufMsg[0x47] = '\0';
    bufMsg[0x48] = '\0';
    bufMsg[0x49] = '\0';
    bufMsg[0x4a] = '\0';
    bufMsg[0x4b] = '\0';
    bufMsg[0x4c] = '\0';
    bufMsg[0x4d] = '\0';
    bufMsg[0x4e] = '\0';
    bufMsg[0x4f] = '\0';
    bufMsg[0x30] = '\0';
    bufMsg[0x31] = '\0';
    bufMsg[0x32] = '\0';
    bufMsg[0x33] = '\0';
    bufMsg[0x34] = '\0';
    bufMsg[0x35] = '\0';
    bufMsg[0x36] = '\0';
    bufMsg[0x37] = '\0';
    bufMsg[0x38] = '\0';
    bufMsg[0x39] = '\0';
    bufMsg[0x3a] = '\0';
    bufMsg[0x3b] = '\0';
    bufMsg[0x3c] = '\0';
    bufMsg[0x3d] = '\0';
    bufMsg[0x3e] = '\0';
    bufMsg[0x3f] = '\0';
    bufMsg[0x20] = '\0';
    bufMsg[0x21] = '\0';
    bufMsg[0x22] = '\0';
    bufMsg[0x23] = '\0';
    bufMsg[0x24] = '\0';
    bufMsg[0x25] = '\0';
    bufMsg[0x26] = '\0';
    bufMsg[0x27] = '\0';
    bufMsg[0x28] = '\0';
    bufMsg[0x29] = '\0';
    bufMsg[0x2a] = '\0';
    bufMsg[0x2b] = '\0';
    bufMsg[0x2c] = '\0';
    bufMsg[0x2d] = '\0';
    bufMsg[0x2e] = '\0';
    bufMsg[0x2f] = '\0';
    bufMsg[0x10] = '\0';
    bufMsg[0x11] = '\0';
    bufMsg[0x12] = '\0';
    bufMsg[0x13] = '\0';
    bufMsg[0x14] = '\0';
    bufMsg[0x15] = '\0';
    bufMsg[0x16] = '\0';
    bufMsg[0x17] = '\0';
    bufMsg[0x18] = '\0';
    bufMsg[0x19] = '\0';
    bufMsg[0x1a] = '\0';
    bufMsg[0x1b] = '\0';
    bufMsg[0x1c] = '\0';
    bufMsg[0x1d] = '\0';
    bufMsg[0x1e] = '\0';
    bufMsg[0x1f] = '\0';
    bufMsg[0] = '\0';
    bufMsg[1] = '\0';
    bufMsg[2] = '\0';
    bufMsg[3] = '\0';
    bufMsg[4] = '\0';
    bufMsg[5] = '\0';
    bufMsg[6] = '\0';
    bufMsg[7] = '\0';
    bufMsg[8] = '\0';
    bufMsg[9] = '\0';
    bufMsg[10] = '\0';
    bufMsg[0xb] = '\0';
    bufMsg[0xc] = '\0';
    bufMsg[0xd] = '\0';
    bufMsg[0xe] = '\0';
    bufMsg[0xf] = '\0';
    __s = ScanChars((FILE *)__stream,0x80,bufMsg);
    if (__s == "PASSED") {
      __n = strlen(pcVar6);
      iVar2 = strncasecmp(pcVar6,bufMsg,__n);
      if (iVar2 != 0) goto LAB_001016fa;
      __s = "PASSED";
    }
  }
LAB_0010170f:
  if (__s == "PASSED") {
    iVar2 = HaveGarbageAtTheEnd((FILE *)__stream);
    if (iVar2 == 0) {
      __s = "PASSED";
    }
    else {
      __s = "FAILED";
    }
  }
  fclose(__stream);
  puts(__s);
  uVar3 = (uint)(__s == "FAILED");
LAB_00101756:
  TestcaseIdx = TestcaseIdx + 1;
  return uVar3;
}

Assistant:

static int Check(void) {
    FILE* const out = fopen("out.txt", "r");
    if (out == NULL) {
        printf("can't open out.txt\n");
        ++TestcaseIdx;
        return -1;
    }
    const char* status = Pass;
    const char* message = GetFromTestcase(TestcaseIdx, ERROR_MESSAGE, IGNORED_EDGE_IDX).String;
    if (message != NULL) { // test error message
        char bufMsg[128] = {0};
        status = ScanChars(out, sizeof(bufMsg), bufMsg);
        if (status == Pass && _strnicmp(message, bufMsg, strlen(message)) != 0) {
            printf("wrong output -- ");
            status = Fail;
        }
    } else { // test spanning tree
        const unsigned vertexCount = GetVertexCount();
        unsigned vertexParent[MAX_VERTEX_COUNT];
        unsigned long long length = 0;
        InitParent(vertexCount, vertexParent);
        for (unsigned idx = 0; idx + 1 < vertexCount; ++idx) {
            unsigned a, b;
            if (ScanUintUint(out, &a, &b) != Pass) {
                status = Fail;
                break;
            }
            const unsigned edgeIdx = FindEdge(a, b);
            if (edgeIdx == IGNORED_EDGE_IDX) {
                printf("wrong output -- ");
                status = Fail;
                break;
            }
            const unsigned rootA = FindRoot(a - 1, vertexParent);
            const unsigned rootB = FindRoot(b - 1, vertexParent);
            if (rootA == rootB) {
                printf("wrong output -- ");
                status = Fail;
                break;
            }
            vertexParent[rootA] = rootB;
            length += GetFromTestcase(TestcaseIdx, EDGE, edgeIdx).Edge.Length;
        }
        if (status == Pass) {
            if (CountRoots(vertexCount, vertexParent) != 1 || length > GetFromTestcase(TestcaseIdx, MST_LENGTH, IGNORED_EDGE_IDX).Integer) {
                printf("wrong output -- ");
                status = Fail;
            }
        }
    }
    if (status == Pass && HaveGarbageAtTheEnd(out)) {
        status = Fail;
    }
    fclose(out);
    printf("%s\n", status);
    ++TestcaseIdx;
    return status == Fail;
}